

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<unsigned_int,_sptk::uint24_t>::Run
          (DataTransform<unsigned_int,_sptk::uint24_t> *this,istream *input_stream)

{
  byte bVar1;
  NumericType NVar2;
  WarningType WVar3;
  ostream *poVar4;
  uint uVar5;
  size_t *__idx;
  uint8_t uVar6;
  uint uVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t uVar10;
  ulong uVar11;
  bool bVar12;
  ushort in_FPUControlWord;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  uint24_t local_29e;
  uint24_t local_29b;
  ushort local_298;
  allocator local_295;
  uint input_data;
  uint8_t *local_290;
  uint8_t *local_288;
  uint8_t *local_280;
  uint8_t *local_278;
  ulong local_270;
  istream *local_268;
  string *local_260;
  long local_258;
  string local_250;
  string word;
  char buffer [128];
  
  local_278 = (this->minimum_value_).value + 1;
  local_288 = (this->maximum_value_).value + 1;
  local_290 = (this->maximum_value_).value + 2;
  local_280 = (this->minimum_value_).value + 2;
  local_260 = &this->print_format_;
  uVar11 = 0;
  local_268 = input_stream;
  do {
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(input_stream,(string *)&word);
      bVar12 = word._M_string_length == 0;
      if (!bVar12) {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        local_298 = in_FPUControlWord | 0xc00;
        local_258 = (long)ROUND(in_ST0);
        input_data = (uint)local_258;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      std::__cxx11::string::~string((string *)&word);
      if (!bVar12) goto LAB_0012a370;
      if (bVar12) {
        if (bVar12) {
LAB_0012a599:
          bVar12 = true;
          if ((this->is_ascii_output_ == true) && ((int)uVar11 % this->num_column_ != 0)) {
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          }
        }
        else {
LAB_0012a5bb:
          bVar12 = false;
        }
        return bVar12;
      }
    }
    else {
      bVar12 = sptk::ReadStream<unsigned_int>(&input_data,input_stream);
      if (!bVar12) goto LAB_0012a599;
LAB_0012a370:
      uVar7 = (uint)*(uint3 *)(this->minimum_value_).value;
      uVar5 = (uint)*(uint3 *)(this->maximum_value_).value;
      local_270 = uVar11;
      if ((uVar7 < uVar5) &&
         ((((NVar2 = this->input_numeric_type_, NVar2 == kFloatingPoint ||
            (NVar2 == kUnsignedInteger)) || (NVar2 == kSignedInteger)) &&
          ((puVar8 = local_278, puVar9 = local_280, bVar1 = (this->minimum_value_).value[0],
           input_data < uVar7 ||
           (puVar8 = local_288, puVar9 = local_290, bVar1 = (this->maximum_value_).value[0],
           uVar5 < input_data)))))) {
        uVar6 = *puVar9;
        uVar10 = *puVar8;
        uVar5 = (uint)bVar1;
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&word,(int)local_270);
          std::operator<<(poVar4,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_295);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          input_stream = local_268;
          if (WVar3 == kExit) goto LAB_0012a5bb;
        }
      }
      else if (this->rounding_ == true) {
        if (input_data == 0) {
          uVar6 = '\0';
          uVar10 = '\0';
          uVar5 = 0;
        }
        else {
          uVar5 = (uint)((double)input_data + 0.5);
          uVar10 = (uint8_t)(uVar5 >> 8);
          uVar6 = (uint8_t)(uVar5 >> 0x10);
        }
      }
      else {
        uVar10 = (uint8_t)(input_data >> 8);
        uVar6 = (uint8_t)(input_data >> 0x10);
        uVar5 = input_data;
      }
      if (this->is_ascii_output_ == true) {
        local_29b.value[0] = (uint8_t)uVar5;
        local_29b.value[1] = uVar10;
        local_29b.value[2] = uVar6;
        bVar12 = sptk::SnPrintf<sptk::uint24_t>(&local_29b,local_260,0x80,buffer);
        if (!bVar12) goto LAB_0012a5bb;
        std::operator<<((ostream *)&std::cout,buffer);
        if (((int)local_270 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          uVar11 = local_270;
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
          uVar11 = local_270;
        }
      }
      else {
        local_29e.value[0] = (uint8_t)uVar5;
        local_29e.value[1] = uVar10;
        local_29e.value[2] = uVar6;
        bVar12 = sptk::WriteStream<sptk::uint24_t>(&local_29e,(ostream *)&std::cout);
        uVar11 = local_270;
        if (!bVar12) goto LAB_0012a5bb;
      }
    }
    uVar11 = (ulong)((int)uVar11 + 1);
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }